

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Char * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::format
          (BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,Char **format_str,Arg *arg)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  undefined8 uVar6;
  CStringRef message;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  ULongLong value_1;
  Arg precision_arg;
  ULongLong value;
  Arg width_arg;
  Char *p;
  Char c;
  FormatSpec spec;
  Char *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  CStringRef in_stack_fffffffffffffde0;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *in_stack_fffffffffffffde8;
  FormatSpec *in_stack_fffffffffffffdf0;
  char **in_stack_fffffffffffffe00;
  char (*in_stack_fffffffffffffe10) [8];
  CStringRef in_stack_fffffffffffffe18;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *in_stack_fffffffffffffe20;
  Arg *in_stack_fffffffffffffe28;
  Arg *in_stack_fffffffffffffe30;
  Char **in_stack_fffffffffffffe38;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *in_stack_fffffffffffffe40;
  BasicCStringRef<char> local_150;
  undefined1 local_141;
  BasicCStringRef<char> local_140 [6];
  BasicCStringRef<char> local_110;
  BasicCStringRef<char> local_108;
  BasicCStringRef<char> local_100;
  BasicCStringRef<char> local_f8;
  BasicCStringRef<char> local_f0;
  ulong local_e8;
  BasicCStringRef<char> local_e0;
  uint local_d8;
  int iStack_d4;
  int local_c8;
  BasicCStringRef<char> local_b8;
  BasicCStringRef<char> local_b0;
  BasicCStringRef<char> local_a8;
  BasicCStringRef<char> local_a0;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *local_98;
  BasicCStringRef<char> local_90;
  uint local_88;
  int iStack_84;
  undefined4 local_78;
  BasicCStringRef<char> local_58;
  char *local_50;
  char local_41;
  uint local_40;
  int local_3c;
  int local_38;
  uint local_34;
  uint local_30;
  char local_2c;
  char *local_28;
  undefined8 *local_20;
  
  local_28 = (char *)*in_RSI;
  local_20 = in_RDX;
  FormatSpec::FormatSpec
            (in_stack_fffffffffffffdf0,(uint)((ulong)in_stack_fffffffffffffde8 >> 0x20),
             (char)((ulong)in_stack_fffffffffffffde8 >> 0x18),
             (wchar_t)((ulong)in_stack_fffffffffffffde0.data_ >> 0x20));
  if (*local_28 == ':') {
    if (*(int *)(local_20 + 2) == 0xe) {
      (*(code *)local_20[1])(in_RDI,*local_20,&local_28);
      return local_28;
    }
    pcVar5 = local_28 + 1;
    local_41 = *pcVar5;
    if (local_41 != '\0') {
      local_50 = local_28 + 2;
      local_38 = 0;
      do {
        switch(*local_50) {
        case '<':
          local_38 = 1;
          break;
        case '=':
          local_38 = 4;
          break;
        case '>':
          local_38 = 2;
          break;
        case '^':
          local_38 = 3;
        }
        if (local_38 != 0) {
          if (local_50 == pcVar5) {
            local_28 = local_28 + 2;
          }
          else {
            if (local_41 == '}') break;
            if (local_41 == '{') {
              local_28 = pcVar5;
              uVar6 = __cxa_allocate_exception(0x10);
              BasicCStringRef<char>::BasicCStringRef(&local_58,"invalid fill character \'{\'");
              FormatError::FormatError
                        ((FormatError *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
              __cxa_throw(uVar6,&FormatError::typeinfo,FormatError::~FormatError);
            }
            local_28 = local_28 + 3;
            local_3c = (int)local_41;
          }
          pcVar5 = local_28;
          if (local_38 == 4) {
            internal::require_numeric_argument
                      (in_stack_fffffffffffffe30,(char)((ulong)in_stack_fffffffffffffe28 >> 0x38));
            pcVar5 = local_28;
          }
          break;
        }
        local_50 = local_50 + -1;
      } while (pcVar5 <= local_50);
    }
    local_28 = pcVar5;
    cVar1 = *local_28;
    if (cVar1 == ' ') {
      internal::check_sign<char>((char **)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      local_34 = local_34 | 1;
    }
    else if (cVar1 == '+') {
      internal::check_sign<char>((char **)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      local_34 = local_34 | 3;
    }
    else if (cVar1 == '-') {
      internal::check_sign<char>((char **)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      local_34 = local_34 | 4;
    }
    if (*local_28 == '#') {
      internal::require_numeric_argument
                (in_stack_fffffffffffffe30,(char)((ulong)in_stack_fffffffffffffe28 >> 0x38));
      local_34 = local_34 | 8;
      local_28 = local_28 + 1;
    }
    if (*local_28 == '0') {
      internal::require_numeric_argument
                (in_stack_fffffffffffffe30,(char)((ulong)in_stack_fffffffffffffe28 >> 0x38));
      local_38 = 4;
      local_3c = 0x30;
      local_28 = local_28 + 1;
    }
    if ((*local_28 < '0') || ('9' < *local_28)) {
      if (*local_28 == '{') {
        local_28 = local_28 + 1;
        bVar3 = internal::is_name_start<char>(*local_28);
        if (bVar3) {
          parse_arg_name(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        }
        else {
          parse_arg_index(in_stack_fffffffffffffe20,(Char **)in_stack_fffffffffffffe18.data_);
        }
        pcVar5 = local_28 + 1;
        if (*local_28 != '}') {
          local_28 = pcVar5;
          uVar6 = __cxa_allocate_exception(0x10);
          BasicCStringRef<char>::BasicCStringRef(&local_90,"invalid format string");
          FormatError::FormatError
                    ((FormatError *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
          __cxa_throw(uVar6,&FormatError::typeinfo,FormatError::~FormatError);
        }
        local_98 = (BasicFormatter<char,_fmt::ArgFormatter<char>_> *)0x0;
        switch(local_78) {
        case 2:
          if ((int)local_88 < 0) {
            local_28 = pcVar5;
            uVar6 = __cxa_allocate_exception(0x10);
            BasicCStringRef<char>::BasicCStringRef(&local_a0,"negative width");
            FormatError::FormatError
                      ((FormatError *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
            __cxa_throw(uVar6,&FormatError::typeinfo,FormatError::~FormatError);
          }
          local_98 = (BasicFormatter<char,_fmt::ArgFormatter<char>_> *)(long)(int)local_88;
          break;
        case 3:
          local_98 = (BasicFormatter<char,_fmt::ArgFormatter<char>_> *)(ulong)local_88;
          break;
        case 4:
          if (iStack_84 < 0) {
            local_28 = pcVar5;
            uVar6 = __cxa_allocate_exception(0x10);
            BasicCStringRef<char>::BasicCStringRef(&local_a8,"negative width");
            FormatError::FormatError
                      ((FormatError *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
            __cxa_throw(uVar6,&FormatError::typeinfo,FormatError::~FormatError);
          }
          local_98 = (BasicFormatter<char,_fmt::ArgFormatter<char>_> *)CONCAT44(iStack_84,local_88);
          break;
        case 5:
          local_98 = (BasicFormatter<char,_fmt::ArgFormatter<char>_> *)CONCAT44(iStack_84,local_88);
          break;
        default:
          local_28 = pcVar5;
          uVar6 = __cxa_allocate_exception(0x10);
          BasicCStringRef<char>::BasicCStringRef(&local_b0,"width is not integer");
          FormatError::FormatError
                    ((FormatError *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
          __cxa_throw(uVar6,&FormatError::typeinfo,FormatError::~FormatError);
        }
        in_stack_fffffffffffffe40 = local_98;
        local_28 = pcVar5;
        iVar4 = std::numeric_limits<int>::max();
        if ((BasicFormatter<char,_fmt::ArgFormatter<char>_> *)(long)iVar4 <
            in_stack_fffffffffffffe40) {
          uVar6 = __cxa_allocate_exception(0x10);
          BasicCStringRef<char>::BasicCStringRef(&local_b8,"number is too big");
          FormatError::FormatError
                    ((FormatError *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
          __cxa_throw(uVar6,&FormatError::typeinfo,FormatError::~FormatError);
        }
        local_40 = (uint)local_98;
      }
    }
    else {
      local_40 = internal::parse_nonnegative_int<char>(in_stack_fffffffffffffe00);
    }
    if (*local_28 == '.') {
      pcVar5 = local_28 + 1;
      local_30 = 0;
      if ((*pcVar5 < '0') || ('9' < *pcVar5)) {
        if (*pcVar5 != '{') {
          local_28 = pcVar5;
          uVar6 = __cxa_allocate_exception(0x10);
          BasicCStringRef<char>::BasicCStringRef(&local_110,"missing precision specifier");
          FormatError::FormatError
                    ((FormatError *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
          __cxa_throw(uVar6,&FormatError::typeinfo,FormatError::~FormatError);
        }
        local_28 = local_28 + 2;
        bVar3 = internal::is_name_start<char>(*local_28);
        if (bVar3) {
          parse_arg_name(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        }
        else {
          parse_arg_index(in_stack_fffffffffffffe20,(Char **)in_stack_fffffffffffffe18.data_);
        }
        pcVar5 = local_28 + 1;
        if (*local_28 != '}') {
          local_28 = pcVar5;
          uVar6 = __cxa_allocate_exception(0x10);
          BasicCStringRef<char>::BasicCStringRef(&local_e0,"invalid format string");
          FormatError::FormatError
                    ((FormatError *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
          __cxa_throw(uVar6,&FormatError::typeinfo,FormatError::~FormatError);
        }
        local_e8 = 0;
        in_stack_fffffffffffffe28 = (Arg *)(ulong)(local_c8 - 2);
        switch(in_stack_fffffffffffffe28) {
        case (Arg *)0x0:
          if ((int)local_d8 < 0) {
            local_28 = pcVar5;
            uVar6 = __cxa_allocate_exception(0x10);
            BasicCStringRef<char>::BasicCStringRef(&local_f0,"negative precision");
            FormatError::FormatError
                      ((FormatError *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
            __cxa_throw(uVar6,&FormatError::typeinfo,FormatError::~FormatError);
          }
          local_e8 = (ulong)(int)local_d8;
          break;
        case (Arg *)0x1:
          local_e8 = (ulong)local_d8;
          break;
        case (Arg *)0x2:
          if (iStack_d4 < 0) {
            local_28 = pcVar5;
            uVar6 = __cxa_allocate_exception(0x10);
            BasicCStringRef<char>::BasicCStringRef(&local_f8,"negative precision");
            FormatError::FormatError
                      ((FormatError *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
            __cxa_throw(uVar6,&FormatError::typeinfo,FormatError::~FormatError);
          }
          local_e8 = CONCAT44(iStack_d4,local_d8);
          break;
        case (Arg *)0x3:
          local_e8 = CONCAT44(iStack_d4,local_d8);
          break;
        default:
          local_28 = pcVar5;
          uVar6 = __cxa_allocate_exception(0x10);
          BasicCStringRef<char>::BasicCStringRef(&local_100,"precision is not integer");
          FormatError::FormatError
                    ((FormatError *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
          __cxa_throw(uVar6,&FormatError::typeinfo,FormatError::~FormatError);
        }
        uVar2 = local_e8;
        local_28 = pcVar5;
        iVar4 = std::numeric_limits<int>::max();
        if ((ulong)(long)iVar4 < uVar2) {
          uVar6 = __cxa_allocate_exception(0x10);
          BasicCStringRef<char>::BasicCStringRef(&local_108,"number is too big");
          FormatError::FormatError
                    ((FormatError *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
          __cxa_throw(uVar6,&FormatError::typeinfo,FormatError::~FormatError);
        }
        local_30 = (uint)local_e8;
      }
      else {
        local_28 = pcVar5;
        local_30 = internal::parse_nonnegative_int<char>(in_stack_fffffffffffffe00);
      }
      if ((*(int *)(local_20 + 2) < 8) || (*(int *)(local_20 + 2) == 0xd)) {
        local_141 = 1;
        uVar6 = __cxa_allocate_exception(0x10);
        BasicCStringRef<char>::BasicCStringRef
                  (local_140,"precision not allowed in {} format specifier");
        format<char[8]>(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
        BasicCStringRef<char>::BasicCStringRef
                  ((BasicCStringRef<char> *)in_stack_fffffffffffffde0.data_,
                   in_stack_fffffffffffffdd8);
        FormatError::FormatError((FormatError *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0)
        ;
        local_141 = 0;
        __cxa_throw(uVar6,&FormatError::typeinfo,FormatError::~FormatError);
      }
    }
    if ((*local_28 != '}') && (*local_28 != '\0')) {
      local_2c = *local_28;
      local_28 = local_28 + 1;
    }
  }
  if (*local_28 == '}') {
    local_28 = local_28 + 1;
    ArgFormatter<char>::ArgFormatter
              ((ArgFormatter<char> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (FormatSpec *)in_stack_fffffffffffffde0.data_,(char *)in_stack_fffffffffffffdd8);
    ArgVisitor<fmt::ArgFormatter<char>,_void>::visit
              ((ArgVisitor<fmt::ArgFormatter<char>,_void> *)in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe28);
    return local_28;
  }
  local_28 = local_28 + 1;
  message.data_ = (char *)__cxa_allocate_exception(0x10);
  BasicCStringRef<char>::BasicCStringRef(&local_150,"missing \'}\' in format string");
  FormatError::FormatError((FormatError *)in_stack_fffffffffffffdd8,message);
  __cxa_throw(message.data_,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

const Char *BasicFormatter<Char, ArgFormatter>::format(
    const Char *&format_str, const internal::Arg &arg) {
  using internal::Arg;
  const Char *s = format_str;
  FormatSpec spec;
  if (*s == ':') {
    if (arg.type == Arg::CUSTOM) {
      arg.custom.format(this, arg.custom.value, &s);
      return s;
    }
    ++s;
    // Parse fill and alignment.
    if (Char c = *s) {
      const Char *p = s + 1;
      spec.align_ = ALIGN_DEFAULT;
      do {
        switch (*p) {
          case '<':
            spec.align_ = ALIGN_LEFT;
            break;
          case '>':
            spec.align_ = ALIGN_RIGHT;
            break;
          case '=':
            spec.align_ = ALIGN_NUMERIC;
            break;
          case '^':
            spec.align_ = ALIGN_CENTER;
            break;
        }
        if (spec.align_ != ALIGN_DEFAULT) {
          if (p != s) {
            if (c == '}') break;
            if (c == '{')
              FMT_THROW(FormatError("invalid fill character '{'"));
            s += 2;
            spec.fill_ = c;
          } else ++s;
          if (spec.align_ == ALIGN_NUMERIC)
            require_numeric_argument(arg, '=');
          break;
        }
      } while (--p >= s);
    }

    // Parse sign.
    switch (*s) {
      case '+':
        check_sign(s, arg);
        spec.flags_ |= SIGN_FLAG | PLUS_FLAG;
        break;
      case '-':
        check_sign(s, arg);
        spec.flags_ |= MINUS_FLAG;
        break;
      case ' ':
        check_sign(s, arg);
        spec.flags_ |= SIGN_FLAG;
        break;
    }

    if (*s == '#') {
      require_numeric_argument(arg, '#');
      spec.flags_ |= HASH_FLAG;
      ++s;
    }

    // Parse zero flag.
    if (*s == '0') {
      require_numeric_argument(arg, '0');
      spec.align_ = ALIGN_NUMERIC;
      spec.fill_ = '0';
      ++s;
    }

    // Parse width.
    if ('0' <= *s && *s <= '9') {
      spec.width_ = internal::parse_nonnegative_int(s);
    } else if (*s == '{') {
      ++s;
      Arg width_arg = internal::is_name_start(*s) ?
            parse_arg_name(s) : parse_arg_index(s);
      if (*s++ != '}')
        FMT_THROW(FormatError("invalid format string"));
      ULongLong value = 0;
      switch (width_arg.type) {
      case Arg::INT:
        if (width_arg.int_value < 0)
          FMT_THROW(FormatError("negative width"));
        value = width_arg.int_value;
        break;
      case Arg::UINT:
        value = width_arg.uint_value;
        break;
      case Arg::LONG_LONG:
        if (width_arg.long_long_value < 0)
          FMT_THROW(FormatError("negative width"));
        value = width_arg.long_long_value;
        break;
      case Arg::ULONG_LONG:
        value = width_arg.ulong_long_value;
        break;
      default:
        FMT_THROW(FormatError("width is not integer"));
      }
      if (value > (std::numeric_limits<int>::max)())
        FMT_THROW(FormatError("number is too big"));
      spec.width_ = static_cast<int>(value);
    }

    // Parse precision.
    if (*s == '.') {
      ++s;
      spec.precision_ = 0;
      if ('0' <= *s && *s <= '9') {
        spec.precision_ = internal::parse_nonnegative_int(s);
      } else if (*s == '{') {
        ++s;
        Arg precision_arg = internal::is_name_start(*s) ?
              parse_arg_name(s) : parse_arg_index(s);
        if (*s++ != '}')
          FMT_THROW(FormatError("invalid format string"));
        ULongLong value = 0;
        switch (precision_arg.type) {
          case Arg::INT:
            if (precision_arg.int_value < 0)
              FMT_THROW(FormatError("negative precision"));
            value = precision_arg.int_value;
            break;
          case Arg::UINT:
            value = precision_arg.uint_value;
            break;
          case Arg::LONG_LONG:
            if (precision_arg.long_long_value < 0)
              FMT_THROW(FormatError("negative precision"));
            value = precision_arg.long_long_value;
            break;
          case Arg::ULONG_LONG:
            value = precision_arg.ulong_long_value;
            break;
          default:
            FMT_THROW(FormatError("precision is not integer"));
        }
        if (value > (std::numeric_limits<int>::max)())
          FMT_THROW(FormatError("number is too big"));
        spec.precision_ = static_cast<int>(value);
      } else {
        FMT_THROW(FormatError("missing precision specifier"));
      }
      if (arg.type <= Arg::LAST_INTEGER_TYPE || arg.type == Arg::POINTER) {
        FMT_THROW(FormatError(
            fmt::format("precision not allowed in {} format specifier",
            arg.type == Arg::POINTER ? "pointer" : "integer")));
      }
    }

    // Parse type.
    if (*s != '}' && *s)
      spec.type_ = static_cast<char>(*s++);
  }

  if (*s++ != '}')
    FMT_THROW(FormatError("missing '}' in format string"));

  // Format argument.
  ArgFormatter(*this, spec, s - 1).visit(arg);
  return s;
}